

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printCounts(ConsoleReporter *this,string *label,Counts *counts)

{
  void *this_00;
  size_t sVar1;
  ostream *poVar2;
  Counts *in_RDX;
  string *in_RSI;
  long in_RDI;
  
  sVar1 = Counts::total(in_RDX);
  if (sVar1 == 1) {
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x168),"1 ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::operator<<(poVar2," - ");
    if (in_RDX->failed == 0) {
      std::operator<<(*(ostream **)(in_RDI + 0x168),"passed");
    }
    else {
      std::operator<<(*(ostream **)(in_RDI + 0x168),"failed");
    }
  }
  else {
    this_00 = *(void **)(in_RDI + 0x168);
    sVar1 = Counts::total(in_RDX);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,sVar1);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::operator<<(poVar2,"s ");
    if (in_RDX->passed == 0) {
      if (in_RDX->failed == 2) {
        std::operator<<(*(ostream **)(in_RDI + 0x168),"- both failed");
      }
      else {
        std::operator<<(*(ostream **)(in_RDI + 0x168),"- all failed");
      }
    }
    else if (in_RDX->failed == 0) {
      if (in_RDX->passed == 2) {
        std::operator<<(*(ostream **)(in_RDI + 0x168),"- both passed");
      }
      else {
        std::operator<<(*(ostream **)(in_RDI + 0x168),"- all passed");
      }
    }
    else {
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x168),"- ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX->failed);
      std::operator<<(poVar2," failed");
    }
  }
  return;
}

Assistant:

void printCounts( std::string const& label, Counts const& counts ) {
            if( counts.total() == 1 ) {
                stream << "1 " << label << " - ";
                if( counts.failed )
                    stream << "failed";
                else
                    stream << "passed";
            }
            else {
                stream << counts.total() << " " << label << "s ";
                if( counts.passed ) {
                    if( counts.failed )
                        stream << "- " << counts.failed << " failed";
                    else if( counts.passed == 2 )
                        stream << "- both passed";
                    else
                        stream << "- all passed";
                }
                else {
                    if( counts.failed == 2 )
                        stream << "- both failed";
                    else
                        stream << "- all failed";
                }
            }
        }